

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryOutStream.h
# Opt level: O1

void __thiscall UnitTest::MemoryOutStream::~MemoryOutStream(MemoryOutStream *this,void **vtt)

{
  undefined1 *puVar1;
  _func_int **pp_Var2;
  undefined1 *puVar3;
  
  pp_Var2 = (_func_int **)*vtt;
  (this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
       = pp_Var2;
  *(void **)((long)&(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream + (long)pp_Var2[-3]) = vtt[5];
  puVar3 = *(undefined1 **)
            &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
             field_0x70;
  puVar1 = &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
            field_0x80;
  if (puVar3 != puVar1) {
    operator_delete(puVar3,*(long *)puVar1 + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  return;
}

Assistant:

~MemoryOutStream() {}